

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_unpack.h
# Opt level: O2

void serialization::
     unserialize_unpack<char_const*const*&,serialization::json_iarchive,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&>
               (char ***arg,json_iarchive *ar,
               vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               *front)

{
  char *key;
  
  key = **arg;
  json_iarchive::load_key_start(ar,key);
  unserialize_helper<serialization::json_iarchive,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
            (ar,front);
  json_iarchive::load_key_end(ar,key);
  *arg = *arg + 1;
  return;
}

Assistant:

inline void unserialize_unpack(Argument && arg, const Archive & ar, T && front, Args&& ... next)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto key = *arg;
    ar.load_key_start(key);
    unserialize_helper(ar, front);
    ar.load_key_end(key);

    unserialize_unpack(++arg, ar, std::forward<Args>(next)...);
}